

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoods
          (BeagleCPUImpl<double,_1,_0> *this,int parIndex,int childIndex,int probIndex,
          int categoryWeightsIndex,int stateFrequenciesIndex,int scalingFactorsIndex,
          double *outSumLogLikelihood)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  int *piVar13;
  double *pdVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  double *pdVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  double *pdVar29;
  double *pdVar30;
  long lVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  pdVar9 = this->gPartials[parIndex];
  pdVar10 = this->gTransitionMatrices[probIndex];
  pdVar11 = this->gCategoryWeights[categoryWeightsIndex];
  pdVar12 = this->gStateFrequencies[stateFrequenciesIndex];
  memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
  if ((childIndex < this->kTipCount) &&
     (piVar13 = this->gTipStates[childIndex], piVar13 != (int *)0x0)) {
    iVar22 = this->kCategoryCount;
    uVar5 = this->kPatternCount;
    uVar20 = (ulong)uVar5;
    if (0 < (long)iVar22) {
      iVar6 = this->kPartialsPaddedStateCount;
      iVar17 = this->kMatrixSize;
      uVar7 = this->kStateCount;
      lVar27 = 0;
      iVar25 = 0;
      lVar18 = 0;
      do {
        if (0 < (int)uVar5) {
          pdVar21 = this->integrationTmp;
          iVar8 = this->kTransPaddedStateCount;
          lVar18 = (long)(int)lVar18;
          uVar23 = 0;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = pdVar11[lVar27];
          pdVar30 = pdVar9 + lVar18;
          iVar24 = 0;
          do {
            if (0 < (int)uVar7) {
              pdVar29 = pdVar10 + (long)iVar25 + (long)piVar13[uVar23];
              uVar19 = 0;
              do {
                dVar32 = *pdVar29;
                pdVar29 = pdVar29 + iVar8;
                auVar1._8_8_ = 0;
                auVar1._0_8_ = pdVar21[(long)iVar24 + uVar19];
                auVar35._8_8_ = 0;
                auVar35._0_8_ = dVar32 * pdVar30[uVar19];
                auVar34 = vfmadd213sd_fma(auVar35,auVar33,auVar1);
                pdVar21[(long)iVar24 + uVar19] = auVar34._0_8_;
                uVar19 = uVar19 + 1;
              } while (uVar7 != uVar19);
              iVar24 = iVar24 + (int)uVar19;
            }
            lVar18 = lVar18 + iVar6;
            uVar23 = uVar23 + 1;
            pdVar30 = pdVar30 + iVar6;
          } while (uVar23 != uVar20);
        }
        iVar25 = iVar25 + iVar17;
        lVar27 = lVar27 + 1;
      } while (lVar27 != iVar22);
    }
  }
  else {
    iVar22 = this->kCategoryCount;
    uVar5 = this->kPatternCount;
    uVar20 = (ulong)uVar5;
    if (0 < (long)iVar22) {
      iVar6 = this->kMatrixSize;
      uVar7 = this->kStateCount;
      iVar17 = 0;
      lVar18 = (long)this->kPartialsPaddedStateCount;
      pdVar30 = this->gPartials[childIndex];
      uVar16 = uVar7 + 3;
      if (-1 < (int)uVar7) {
        uVar16 = uVar7;
      }
      lVar26 = 0;
      lVar27 = 0;
      do {
        if (0 < (int)uVar5) {
          pdVar14 = this->integrationTmp;
          lVar26 = (long)(int)lVar26;
          uVar28 = 0;
          lVar31 = 0;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = pdVar11[lVar27];
          pdVar21 = pdVar30 + lVar26 + 2;
          pdVar29 = pdVar30 + lVar26;
          do {
            if (0 < (int)uVar7) {
              lVar31 = (long)(int)lVar31;
              uVar23 = 0;
              iVar25 = iVar17;
              do {
                if ((int)uVar7 < 4) {
                  auVar36 = ZEXT816(0);
                  uVar19 = 0;
                }
                else {
                  auVar36 = ZEXT816(0);
                  uVar19 = 0;
                  do {
                    auVar36 = vfmadd231pd_fma(auVar36,*(undefined1 (*) [16])
                                                       (pdVar10 + (long)iVar25 + uVar19),
                                              *(undefined1 (*) [16])(pdVar21 + (uVar19 - 2)));
                    auVar36 = vfmadd231pd_fma(auVar36,*(undefined1 (*) [16])
                                                       (pdVar10 + (long)iVar25 + uVar19 + 2),
                                              *(undefined1 (*) [16])(pdVar21 + uVar19));
                    uVar19 = uVar19 + 4;
                  } while ((long)uVar19 < (long)(int)(uVar16 & 0xfffffffc));
                }
                dVar32 = auVar36._0_8_;
                if ((int)uVar19 < (int)uVar7) {
                  uVar19 = uVar19 & 0xffffffff;
                  auVar33 = auVar36;
                  do {
                    auVar40._8_8_ = 0;
                    auVar40._0_8_ = pdVar10[(long)iVar25 + uVar19];
                    auVar2._8_8_ = 0;
                    auVar2._0_8_ = pdVar29[uVar19];
                    auVar33 = vfmadd231sd_fma(auVar33,auVar40,auVar2);
                    dVar32 = auVar33._0_8_;
                    uVar19 = uVar19 + 1;
                  } while (uVar7 != uVar19);
                }
                auVar33 = vshufpd_avx(auVar36,auVar36,1);
                iVar25 = iVar25 + uVar7 + 1;
                lVar15 = lVar26 + uVar23;
                uVar23 = uVar23 + 1;
                auVar36._8_8_ = 0;
                auVar36._0_8_ = pdVar14[lVar31];
                auVar37._8_8_ = 0;
                auVar37._0_8_ = (auVar33._0_8_ + dVar32) * pdVar9[lVar15];
                auVar36 = vfmadd213sd_fma(auVar37,auVar34,auVar36);
                pdVar14[lVar31] = auVar36._0_8_;
                lVar31 = lVar31 + 1;
              } while (uVar23 != uVar7);
            }
            lVar26 = lVar26 + lVar18;
            uVar28 = uVar28 + 1;
            pdVar21 = pdVar21 + lVar18;
            pdVar29 = pdVar29 + lVar18;
          } while (uVar28 != uVar5);
        }
        lVar27 = lVar27 + 1;
        iVar17 = iVar17 + iVar6;
      } while (lVar27 != iVar22);
    }
  }
  if (0 < (int)uVar20) {
    lVar18 = 0;
    iVar22 = 0;
    do {
      iVar6 = this->kStateCount;
      if ((long)iVar6 < 1) {
        dVar32 = 0.0;
      }
      else {
        auVar34 = ZEXT816(0);
        lVar27 = 0;
        do {
          auVar38._8_8_ = 0;
          auVar38._0_8_ = pdVar12[lVar27];
          auVar3._8_8_ = 0;
          auVar3._0_8_ = this->integrationTmp[iVar22 + lVar27];
          auVar34 = vfmadd231sd_fma(auVar34,auVar38,auVar3);
          dVar32 = auVar34._0_8_;
          lVar27 = lVar27 + 1;
        } while (iVar6 != lVar27);
        iVar22 = iVar22 + iVar6;
      }
      dVar32 = log(dVar32);
      this->outLogLikelihoodsTmp[lVar18] = dVar32;
      lVar18 = lVar18 + 1;
      uVar20 = (ulong)this->kPatternCount;
    } while (lVar18 < (long)uVar20);
  }
  if (scalingFactorsIndex != -1) {
    if ((int)uVar20 < 1) {
      *outSumLogLikelihood = 0.0;
      return 0;
    }
    uVar23 = 0;
    pdVar9 = this->gScaleBuffers[scalingFactorsIndex];
    pdVar10 = this->outLogLikelihoodsTmp;
    do {
      pdVar10[uVar23] = pdVar9[uVar23] + pdVar10[uVar23];
      uVar23 = uVar23 + 1;
    } while ((uVar20 & 0xffffffff) != uVar23);
  }
  *outSumLogLikelihood = 0.0;
  if ((int)uVar20 < 1) {
    return 0;
  }
  pdVar9 = this->gPatternWeights;
  pdVar10 = this->outLogLikelihoodsTmp;
  auVar34 = ZEXT816(0) << 0x40;
  uVar23 = 0;
  do {
    auVar39._8_8_ = 0;
    auVar39._0_8_ = pdVar10[uVar23];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = pdVar9[uVar23];
    auVar34 = vfmadd231sd_fma(auVar34,auVar39,auVar4);
    uVar23 = uVar23 + 1;
    dVar32 = auVar34._0_8_;
    *outSumLogLikelihood = dVar32;
  } while ((uVar20 & 0xffffffff) != uVar23);
  return (uint)(!NAN(dVar32) && !NAN(dVar32)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoods(const int parIndex,
                                                     const int childIndex,
                                                     const int probIndex,
                                                     const int categoryWeightsIndex,
                                                     const int stateFrequenciesIndex,
                                                     const int scalingFactorsIndex,
                                                     double* outSumLogLikelihood) {

    assert(parIndex >= kTipCount);

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* partialsParent = gPartials[parIndex];
    const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

    memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));


    if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

        const int* statesChild = gTipStates[childIndex];
        int v = 0; // Index for parent partials

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0; // Index in resulting product-partials (summed over categories)
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {

                const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                // so we can interchange the patterCount and categoryCount loop order?
                int w =  l * kMatrixSize;
                for(int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                    u++;

                    w += kTransPaddedStateCount;
                }
                v += kPartialsPaddedStateCount;
            }
        }

    } else { // Integrate against a partial at the child

        const REALTYPE* partialsChild = gPartials[childIndex];
        int v = 0;
        int stateCountModFour = (kStateCount / 4) * 4;

        for(int l = 0; l < kCategoryCount; l++) {
            int u = 0;
            const REALTYPE weight = wt[l];
            for(int k = 0; k < kPatternCount; k++) {
                int w = l * kMatrixSize;
                const REALTYPE* partialsChildPtr = &partialsChild[v];
                for(int i = 0; i < kStateCount; i++) {
                    double sumOverJA = 0.0, sumOverJB = 0.0;
                    int j = 0;
                    const REALTYPE* transMatrixPtr = &transMatrix[w];
                    for (; j < stateCountModFour; j += 4) {
                        sumOverJA += transMatrixPtr[j + 0] * partialsChildPtr[j + 0];
                        sumOverJB += transMatrixPtr[j + 1] * partialsChildPtr[j + 1];
                        sumOverJA += transMatrixPtr[j + 2] * partialsChildPtr[j + 2];
                        sumOverJB += transMatrixPtr[j + 3] * partialsChildPtr[j + 3];

                    }
                    for (; j < kStateCount; j++) {
                        sumOverJA += transMatrixPtr[j] * partialsChildPtr[j];
                    }
                    //                        for(int j = 0; j < kStateCount; j++) {
                    //                            sumOverJ += transMatrix[w] * partialsChild[v + j];
                    //                            w++;
                    //                        }
                    integrationTmp[u] += (sumOverJA + sumOverJB) * partialsParent[v + i] * weight;
                    u++;

                    w += kStateCount;

                    // increment for the extra column at the end
                    w += T_PAD;
                }
                v += kPartialsPaddedStateCount;
            }
        }
    }

    int u = 0;
    for(int k = 0; k < kPatternCount; k++) {
        REALTYPE sumOverI = 0.0;
        for(int i = 0; i < kStateCount; i++) {
            sumOverI += freqs[i] * integrationTmp[u];
            u++;
        }

        outLogLikelihoodsTmp[k] = log(sumOverI);
    }


    if (scalingFactorsIndex != BEAGLE_OP_NONE) {
        const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
        for(int k=0; k < kPatternCount; k++)
            outLogLikelihoodsTmp[k] += scalingFactors[k];
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}